

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O0

void TPZCreateApproximationSpace::CreateInterfaceElements
               (TPZCompMesh *mesh,bool betweencontinuous,bool multiphysics)

{
  int64_t iVar1;
  byte in_DL;
  TPZCompMesh *in_RDI;
  TPZMultiphysicsElement *mfcel;
  TPZInterpolationSpace *intel;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  TPZChunkVector<TPZCompEl_*,_10> compelvec;
  bool in_stack_0000012f;
  TPZInterpolationSpace *in_stack_00000130;
  long local_100;
  long local_f0;
  TPZCompEl *in_stack_ffffffffffffff18;
  TPZCompEl *pTVar2;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_ffffffffffffff20;
  long local_b0;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_ffffffffffffff68;
  TPZSavable in_stack_ffffffffffffff70;
  
  TPZCompMesh::ElementVec(in_RDI);
  TPZChunkVector<TPZCompEl_*,_10>::TPZChunkVector
            ((TPZChunkVector<TPZCompEl_*,_10> *)in_stack_ffffffffffffff70._vptr_TPZSavable,
             in_stack_ffffffffffffff68);
  iVar1 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                    ((TPZChunkVector<TPZCompEl_*,_10> *)&stack0xffffffffffffff70);
  for (local_b0 = 0; local_b0 < iVar1; local_b0 = local_b0 + 1) {
    in_stack_ffffffffffffff20 =
         (TPZChunkVector<TPZCompEl_*,_10> *)
         TPZChunkVector<TPZCompEl_*,_10>::operator[]
                   (in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18);
    pTVar2 = (TPZCompEl *)(in_stack_ffffffffffffff20->super_TPZSavable)._vptr_TPZSavable;
    if (pTVar2 != (TPZCompEl *)0x0) {
      if ((in_DL & 1) == 0) {
        if (pTVar2 == (TPZCompEl *)0x0) {
          local_f0 = 0;
        }
        else {
          local_f0 = __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
        }
        in_stack_ffffffffffffff18 = pTVar2;
        if (local_f0 != 0) {
          TPZInterpolationSpace::CreateInterfaces(in_stack_00000130,in_stack_0000012f);
          in_stack_ffffffffffffff18 = pTVar2;
        }
      }
      else {
        if (pTVar2 == (TPZCompEl *)0x0) {
          local_100 = 0;
        }
        else {
          local_100 = __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0
                                    );
        }
        if (local_100 != 0) {
          TPZMultiphysicsElement::CreateInterfaces
                    ((TPZMultiphysicsElement *)compelvec.fVec.fExtAlloc[9]);
        }
      }
    }
  }
  TPZChunkVector<TPZCompEl_*,_10>::~TPZChunkVector((TPZChunkVector<TPZCompEl_*,_10> *)0x1bac1f7);
  return;
}

Assistant:

void TPZCreateApproximationSpace::CreateInterfaceElements(TPZCompMesh *mesh, bool betweencontinuous, bool multiphysics)
{
    TPZChunkVector<TPZCompEl *> compelvec = mesh->ElementVec();
    int64_t nel = compelvec.NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = compelvec[el];
        if (!cel) {
            continue;
        }
        if(!multiphysics)
        {
            TPZInterpolationSpace *intel = dynamic_cast<TPZInterpolationSpace *>(cel);
            if (intel) {
                intel->CreateInterfaces(betweencontinuous);
            }
        }
        else {
            TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(cel);
            if (!mfcel) {
                continue;
            }
            mfcel->CreateInterfaces();
        }
        
    }
}